

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.hxx
# Opt level: O2

void miniros::serialization::Serializer<rosgraph_msgs::Log_<std::allocator<void>>>::
     allInOne<miniros::serialization::OStream,rosgraph_msgs::Log_<std::allocator<void>>const&>
               (OStream *stream,Log_<std::allocator<void>_> *m)

{
  Serializer<std_msgs::Header_<std::allocator<void>>>::
  allInOne<miniros::serialization::OStream,std_msgs::Header_<std::allocator<void>>const&>
            (stream,&m->header);
  serialize<signed_char,miniros::serialization::OStream>(stream,&m->level);
  Serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  write<miniros::serialization::OStream>(stream,&m->name);
  Serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  write<miniros::serialization::OStream>(stream,&m->msg);
  Serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  write<miniros::serialization::OStream>(stream,&m->file);
  Serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  write<miniros::serialization::OStream>(stream,&m->function);
  serialize<unsigned_int,miniros::serialization::OStream>(stream,&m->line);
  VectorSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::write<miniros::serialization::OStream>(stream,&m->topics);
  return;
}

Assistant:

inline static void allInOne(Stream& stream, T m)
    {
      stream.next(m.header);
      stream.next(m.level);
      stream.next(m.name);
      stream.next(m.msg);
      stream.next(m.file);
      stream.next(m.function);
      stream.next(m.line);
      stream.next(m.topics);
    }